

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

ostream * pstack::operator<<(ostream *o,Escape *escape)

{
  byte bVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  byte *pbVar5;
  ostream *poVar6;
  void *this;
  JSONEncodingError *pJVar7;
  undefined8 uVar8;
  allocator<char> local_b1;
  string local_b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined1 local_85;
  allocator<char> local_71;
  string local_70;
  uint local_50;
  int local_4c;
  int mask;
  int count;
  unsigned_long v;
  uint local_34;
  const_iterator cStack_30;
  int c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  const_iterator i;
  fmtflags flags;
  Escape *escape_local;
  ostream *o_local;
  
  i._M_current._4_4_ = std::ios_base::flags((ios_base *)(o + *(long *)(*(long *)o + -0x18)));
  local_28._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin(&escape->value);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      cStack_30 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::end(&escape->value);
                      bVar2 = __gnu_cxx::
                              operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        (&local_28,&stack0xffffffffffffffd0);
                      if (((bVar2 ^ 0xffU) & 1) == 0) {
                        std::ios_base::flags
                                  ((ios_base *)(o + *(long *)(*(long *)o + -0x18)),
                                   i._M_current._4_4_);
                        return o;
                      }
                      v = (unsigned_long)
                          __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator++(&local_28,0);
                      pbVar5 = (byte *)__gnu_cxx::
                                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ::operator*((
                                                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&v);
                      bVar1 = *pbVar5;
                      local_34 = (uint)bVar1;
                      if (bVar1 != 8) break;
                      std::operator<<(o,"\\b");
                    }
                    if (bVar1 != 9) break;
                    std::operator<<(o,"\\t");
                  }
                  if (bVar1 != 10) break;
                  std::operator<<(o,"\\n");
                }
                if (bVar1 != 0xc) break;
                std::operator<<(o,"\\f");
              }
              if (bVar1 != 0xd) break;
              std::operator<<(o,"\\r");
            }
            if (bVar1 != 0x22) break;
            std::operator<<(o,"\\\"");
          }
          if (bVar1 != 0x5c) break;
          std::operator<<(o,"\\\\");
        }
        if (0x1f < local_34) break;
        poVar6 = std::operator<<(o,"\\u");
        this = (void *)std::ostream::operator<<(poVar6,std::hex);
        std::ostream::operator<<(this,local_34);
      }
      if ((bVar1 & 0x80) != 0) break;
      std::operator<<(o,bVar1);
    }
    _mask = (ulong)(int)local_34;
    local_4c = 0;
    for (local_50 = 0x80; ((long)(int)local_50 & _mask) != 0; local_50 = (int)local_50 >> 1) {
      if (local_50 == 0) {
        local_85 = 1;
        pJVar7 = (JSONEncodingError *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"malformed UTF-8 string",&local_71);
        JSONEncodingError::JSONEncodingError(pJVar7,&local_70);
        local_85 = 0;
        __cxa_throw(pJVar7,&JSONEncodingError::typeinfo,JSONEncodingError::~JSONEncodingError);
      }
      local_4c = local_4c + 1;
      _mask = (long)(int)(local_50 ^ 0xffffffff) & _mask;
    }
    while (local_4c = local_4c + -1, local_4c != 0) {
      local_90 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_28,0);
      pbVar5 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_90);
      local_34 = (uint)*pbVar5;
      if ((local_34 & 0xc0) != 0x80) {
        pJVar7 = (JSONEncodingError *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"illegal character in multibyte sequence",&local_b1);
        JSONEncodingError::JSONEncodingError(pJVar7,&local_b0);
        __cxa_throw(pJVar7,&JSONEncodingError::typeinfo,JSONEncodingError::~JSONEncodingError);
      }
      _mask = _mask << 6 | (long)(int)(local_34 & 0x3f);
    }
    poVar6 = std::operator<<(o,"\\u");
    uVar8 = std::ostream::operator<<(poVar6,std::hex);
    _Var3 = std::setfill<char>('0');
    poVar6 = std::operator<<(uVar8,_Var3._M_c);
    _Var4 = std::setw(4);
    poVar6 = std::operator<<(poVar6,_Var4);
    std::ostream::operator<<(poVar6,_mask);
  } while( true );
}

Assistant:

inline std::ostream & operator << (std::ostream &o, const Escape &escape)
{
    auto flags(o.flags());
    for (auto i = escape.value.begin(); i != escape.value.end();) {
        int c;
        switch (c = (unsigned char)*i++) {
            case '\b': o << "\\b"; break;
            case '\f': o << "\\f"; break;
            case '\n': o << "\\n"; break;
            case '"': o << "\\\""; break;
            case '\\': o << "\\\\"; break;
            case '\r': o << "\\r"; break;
            case '\t': o << "\\t"; break;
            default:
                if (unsigned(c) < 32) {
                    o << "\\u" << std::hex << unsigned(c);
                } else if (c & 0x80) {
                    // multibyte UTF-8: build up the unicode codepoint.
                    unsigned long v = c;
                    int count = 0;
                    for (int mask = 0x80; mask & v; mask >>= 1) {
                        if (mask == 0)
                            throw JSONEncodingError("malformed UTF-8 string");
                        count++;
                        v &= ~mask;
                    }
                    while (--count) {
                        c = (unsigned char)*i++;
                        if ((c & 0xc0) != 0x80)
                            throw JSONEncodingError("illegal character in multibyte sequence");
                        v = (v << 6) | (c & 0x3f);
                    }
                    o << "\\u" << std::hex << std::setfill('0') << std::setw(4) << v;
                } else {
                    o << (char)c;
                }
                break;
        }
    }
    o.flags(flags);
    return o;
}